

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

host_ca * host_ca_load(char *name)

{
  int iVar1;
  char *pcVar2;
  FILE *fp;
  host_ca *phVar3;
  char *pcVar4;
  size_t sVar5;
  strbuf *psVar6;
  char *__s;
  ptrlen input;
  ptrlen data;
  CertExprBuilder *local_38;
  
  pcVar2 = make_filename(7,name);
  fp = fopen(pcVar2,"r");
  safefree(pcVar2);
  if (fp == (FILE *)0x0) {
    phVar3 = (host_ca *)0x0;
  }
  else {
    phVar3 = host_ca_new();
    pcVar2 = dupstr(name);
    phVar3->name = pcVar2;
    pcVar2 = fgetline((FILE *)fp);
    if (pcVar2 == (char *)0x0) {
      local_38 = (CertExprBuilder *)0x0;
    }
    else {
      local_38 = (CertExprBuilder *)0x0;
      do {
        pcVar4 = strchr(pcVar2,0x3d);
        if (pcVar4 != (char *)0x0) {
          __s = pcVar4 + 1;
          *pcVar4 = '\0';
          sVar5 = strcspn(__s,"\r\n");
          pcVar4[sVar5 + 1] = '\0';
          iVar1 = strcmp(pcVar2,"PublicKey");
          if (iVar1 == 0) {
            sVar5 = strlen(__s);
            input.len = sVar5;
            input.ptr = __s;
            psVar6 = base64_decode_sb(input);
            phVar3->ca_public_key = psVar6;
          }
          else {
            iVar1 = strcmp(pcVar2,"MatchHosts");
            if (iVar1 == 0) {
              if (local_38 == (CertExprBuilder *)0x0) {
                local_38 = cert_expr_builder_new();
              }
              cert_expr_builder_add(local_38,__s);
            }
            else {
              iVar1 = strcmp(pcVar2,"Validity");
              if (iVar1 == 0) {
                sVar5 = strlen(__s);
                data.len = sVar5;
                data.ptr = __s;
                psVar6 = percent_decode_sb(data);
                pcVar4 = strbuf_to_str(psVar6);
                phVar3->validity_expression = pcVar4;
              }
              else {
                iVar1 = strcmp(pcVar2,"PermitRSASHA1");
                if (iVar1 == 0) {
                  iVar1 = atoi(__s);
                  (phVar3->opts).permit_rsa_sha1 = iVar1 != 0;
                }
                else {
                  iVar1 = strcmp(pcVar2,"PermitRSASHA256");
                  if (iVar1 == 0) {
                    iVar1 = atoi(__s);
                    (phVar3->opts).permit_rsa_sha256 = iVar1 != 0;
                  }
                  else {
                    iVar1 = strcmp(pcVar2,"PermitRSASHA512");
                    if (iVar1 == 0) {
                      iVar1 = atoi(__s);
                      (phVar3->opts).permit_rsa_sha512 = iVar1 != 0;
                    }
                  }
                }
              }
            }
          }
        }
        safefree(pcVar2);
        pcVar2 = fgetline((FILE *)fp);
      } while (pcVar2 != (char *)0x0);
    }
    if (local_38 != (CertExprBuilder *)0x0) {
      if (phVar3->validity_expression == (char *)0x0) {
        pcVar2 = cert_expr_expression(local_38);
        phVar3->validity_expression = pcVar2;
      }
      cert_expr_builder_free(local_38);
    }
  }
  return phVar3;
}

Assistant:

host_ca *host_ca_load(const char *name)
{
    char *filename = make_filename(INDEX_HOSTCA, name);
    FILE *fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return NULL;

    host_ca *hca = host_ca_new();
    hca->name = dupstr(name);

    char *line;
    CertExprBuilder *eb = NULL;

    while ( (line = fgetline(fp)) ) {
        char *value = strchr(line, '=');

        if (!value) {
            sfree(line);
            continue;
        }
        *value++ = '\0';
        value[strcspn(value, "\r\n")] = '\0';   /* trim trailing NL */

        if (!strcmp(line, "PublicKey")) {
            hca->ca_public_key = base64_decode_sb(ptrlen_from_asciz(value));
        } else if (!strcmp(line, "MatchHosts")) {
            if (!eb)
                eb = cert_expr_builder_new();
            cert_expr_builder_add(eb, value);
        } else if (!strcmp(line, "Validity")) {
            hca->validity_expression = strbuf_to_str(
                percent_decode_sb(ptrlen_from_asciz(value)));
        } else if (!strcmp(line, "PermitRSASHA1")) {
            hca->opts.permit_rsa_sha1 = atoi(value);
        } else if (!strcmp(line, "PermitRSASHA256")) {
            hca->opts.permit_rsa_sha256 = atoi(value);
        } else if (!strcmp(line, "PermitRSASHA512")) {
            hca->opts.permit_rsa_sha512 = atoi(value);
        }

        sfree(line);
    }

    if (eb) {
        if (!hca->validity_expression) {
            hca->validity_expression = cert_expr_expression(eb);
        }
        cert_expr_builder_free(eb);
    }

    return hca;
}